

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O1

sunindextype SUNDlsMat_denseGETRF(realtype **a,sunindextype m,sunindextype n,sunindextype *p)

{
  realtype rVar1;
  double dVar2;
  realtype *prVar3;
  realtype *prVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (0 < n) {
    lVar11 = (long)m;
    uVar8 = (ulong)(uint)n;
    uVar7 = 1;
    lVar12 = 0;
    uVar5 = 0;
    uVar13 = (ulong)(uint)m;
    do {
      prVar3 = a[uVar5];
      uVar6 = uVar5 + 1;
      uVar9 = (uint)uVar5;
      if ((long)uVar6 < lVar11) {
        uVar14 = uVar5 & 0xffffffff;
        uVar15 = uVar7;
        do {
          uVar10 = uVar15 & 0xffffffff;
          if (ABS(prVar3[uVar15]) <= ABS(prVar3[(int)uVar14])) {
            uVar10 = uVar14;
          }
          uVar15 = uVar15 + 1;
          uVar9 = (uint)uVar10;
          uVar14 = uVar10;
        } while ((uint)m != uVar15);
      }
      p[uVar5] = uVar9;
      if ((prVar3[(int)uVar9] == 0.0) && (!NAN(prVar3[(int)uVar9]))) goto LAB_004fd1ec;
      if (uVar5 != uVar9) {
        uVar14 = 0;
        do {
          prVar4 = a[uVar14];
          rVar1 = prVar4[(int)uVar9];
          prVar4[(int)uVar9] = prVar4[uVar5];
          prVar4[uVar5] = rVar1;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
      if ((long)uVar6 < lVar11) {
        dVar2 = prVar3[uVar5];
        uVar14 = 1;
        do {
          *(double *)((long)prVar3 + uVar14 * 8 + lVar12) =
               *(double *)((long)prVar3 + uVar14 * 8 + lVar12) * (1.0 / dVar2);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      uVar14 = uVar7;
      if (uVar6 < uVar8) {
        do {
          prVar4 = a[uVar14];
          dVar2 = prVar4[uVar5];
          if (dVar2 != 0.0 && (long)uVar6 < lVar11) {
            uVar15 = 1;
            do {
              *(double *)((long)prVar4 + uVar15 * 8 + lVar12) =
                   *(double *)((long)prVar3 + uVar15 * 8 + lVar12) * -dVar2 +
                   *(double *)((long)prVar4 + uVar15 * 8 + lVar12);
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar8);
      }
      uVar7 = uVar7 + 1;
      lVar12 = lVar12 + 8;
      uVar13 = uVar13 - 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar8);
  }
  uVar6 = 0;
LAB_004fd1ec:
  return (sunindextype)uVar6;
}

Assistant:

sunindextype SUNDlsMat_denseGETRF(realtype **a, sunindextype m, sunindextype n, sunindextype *p)
{
  sunindextype i, j, k, l;
  realtype *col_j, *col_k;
  realtype temp, mult, a_kj;

  /* k-th elimination step number */
  for (k=0; k < n; k++) {

    col_k  = a[k];

    /* find l = pivot row number */
    l=k;
    for (i=k+1; i < m; i++)
      if (SUNRabs(col_k[i]) > SUNRabs(col_k[l])) l=i;
    p[k] = l;

    /* check for zero pivot element */
    if (col_k[l] == ZERO) return(k+1);

    /* swap a(k,1:n) and a(l,1:n) if necessary */
    if ( l!= k ) {
      for (i=0; i<n; i++) {
        temp = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = temp;
      }
    }

    /* Scale the elements below the diagonal in
     * column k by 1.0/a(k,k). After the above swap
     * a(k,k) holds the pivot element. This scaling
     * stores the pivot row multipliers a(i,k)/a(k,k)
     * in a(i,k), i=k+1, ..., m-1.
     */
    mult = ONE/col_k[k];
    for(i=k+1; i < m; i++) col_k[i] *= mult;

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., m-1 */
    /* row k is the pivot row after swapping with row l.      */
    /* The computation is done one column at a time,          */
    /* column j=k+1, ..., n-1.                                */

    for (j=k+1; j < n; j++) {

      col_j = a[j];
      a_kj = col_j[k];

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j)  */
      /* a_kj = a(k,j), col_k[i] = - a(i,k)/a(k,k) */

      if (a_kj != ZERO) {
        for (i=k+1; i < m; i++)
          col_j[i] -= a_kj * col_k[i];
      }
    }
  }

  /* return 0 to indicate success */

  return(0);
}